

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDEdgeSurfaceCurve * __thiscall
ON_SubDHeap::AllocateEdgeSurfaceCurve(ON_SubDHeap *this,uint cv_capacity)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  double *p1;
  undefined1 local_40 [8];
  ON_SleepLockGuard guard;
  double *cvx;
  ON_SubDEdgeSurfaceCurve *limit_curve;
  uint cv_capacity_local;
  ON_SubDHeap *this_local;
  
  if ((cv_capacity == 0) || (0x13 < cv_capacity)) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubDHeap *)0x0;
  }
  else {
    sVar2 = ON_FixedSizePool::SizeofElement(&this->m_fsp_limit_curves);
    if ((sVar2 != 0) || (bVar1 = Internal_InitializeLimitCurvesPool(this), bVar1)) {
      guard.m_bIsManagingLock = false;
      guard._9_7_ = 0;
      ON_SleepLockGuard::ON_SleepLockGuard((ON_SleepLockGuard *)local_40,&this->m_fsp_limit_curves);
      this_local = (ON_SubDHeap *)ON_FixedSizePool::AllocateDirtyElement(&this->m_fsp_limit_curves);
      if (9 < cv_capacity) {
        guard._8_8_ = ON_FixedSizePool::AllocateDirtyElement(&this->m_fsp_limit_curves);
      }
      ON_SleepLockGuard::~ON_SleepLockGuard((ON_SleepLockGuard *)local_40);
      if (this_local != (ON_SubDHeap *)0x0) {
        memset(this_local,0,0xf0);
        *(undefined1 *)((long)&(this_local->m_fspv).m_first_block + 1) = 9;
        if (guard._8_8_ != 0) {
          *(undefined1 *)((long)&(this_local->m_fspv).m_first_block + 1) = 0x13;
          (this_local->m_fsp5).m_al_element_stack = (void *)guard._8_8_;
          uVar3 = guard._8_8_ + 0xf0;
          while ((ulong)guard._8_8_ < uVar3) {
            *(double *)guard._8_8_ = ON_DBL_QNAN;
            guard._8_8_ = guard._8_8_ + 8;
          }
        }
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDHeap *)0x0;
    }
  }
  return (ON_SubDEdgeSurfaceCurve *)this_local;
}

Assistant:

class ON_SubDEdgeSurfaceCurve* ON_SubDHeap::AllocateEdgeSurfaceCurve(
  unsigned int cv_capacity
)
{
  if (cv_capacity < 1 || cv_capacity > ON_SubDEdgeSurfaceCurve::MaximumControlPointCapacity)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (0 == this->m_fsp_limit_curves.SizeofElement())
  {
    if( false == this->Internal_InitializeLimitCurvesPool())
      return ON_SUBD_RETURN_ERROR(nullptr);
  }

  ON_SubDEdgeSurfaceCurve* limit_curve = nullptr;
  double* cvx = nullptr;
  {
    ON_SleepLockGuard guard(m_fsp_limit_curves);
    limit_curve = (ON_SubDEdgeSurfaceCurve*)m_fsp_limit_curves.AllocateDirtyElement();
    if (cv_capacity > ON_SubDEdgeSurfaceCurve::MinimumControlPointCapacity)
      cvx = (double*)m_fsp_limit_curves.AllocateDirtyElement();
  }

  if (nullptr != limit_curve)
  {
    memset(limit_curve, 0, sizeof(*limit_curve));
    limit_curve->m_cv_capacity = ON_SubDEdgeSurfaceCurve::MinimumControlPointCapacity;
    if (nullptr != cvx)
    {
      // increase capacity
      limit_curve->m_cv_capacity = ON_SubDEdgeSurfaceCurve::MaximumControlPointCapacity;
      limit_curve->m_cvx = cvx;
      double* p1 = cvx + 3 * (ON_SubDEdgeSurfaceCurve::MaximumControlPointCapacity - ON_SubDEdgeSurfaceCurve::MinimumControlPointCapacity);
      while (cvx < p1)
        *cvx++ = ON_DBL_QNAN;
    }
  }

  return limit_curve;
}